

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O1

double erfinv(double target)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (ABS(target) <= 1.0) {
    dVar5 = 0.0;
    if ((target != 0.0) || (NAN(target))) {
      if ((target != 1.0) || (NAN(target))) {
        if ((target != -1.0) || (NAN(target))) {
          uVar2 = 1;
          dVar7 = 0.4;
          iVar3 = 999999;
          do {
            dVar6 = erf(dVar5);
            bVar4 = uVar2 == (-(uint)(dVar6 <= target) | 1);
            uVar1 = (uint)(dVar6 <= target) * 2 - 1;
            if (!bVar4) {
              uVar1 = uVar2;
            }
            uVar2 = uVar1;
            dVar7 = dVar7 * *(double *)(&DAT_0014dbd0 + (ulong)bVar4 * 8);
            dVar5 = (double)(int)uVar2 * dVar7 + dVar5;
            bVar4 = iVar3 != 0;
            iVar3 = iVar3 + -1;
          } while ((1e-09 <= dVar7) && (bVar4));
        }
        else {
          dVar5 = -1e+24;
        }
      }
      else {
        dVar5 = 1e+24;
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"argument for erfinv outside of domain",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    dVar5 = 0.0;
  }
  return dVar5;
}

Assistant:

double erfinv(double target)
{
	double stepsize = 0.4; // starting stepsize
	double source = 0.0;
	int direction = 1; // current direction 1-up, -1-down
	double error = 0.000000001;
	
	if( target > 1.0 || target < -1.0 ) {
		cout << "argument for erfinv outside of domain" << endl;
		return 0.0; // I mean NaN
	}
	if( target==0.0 ) return 0.0;
	if( target==1.0 ) return 1e24; // replacement for inf
	if( target==-1.0 ) return -1e24; // replacement for -inf
	
	int k;
	for( k=0; k<1000000; k++) {
		double current = erf( source );
		
		if(current > target) {
			if(direction == 1) {
				// too large and direction up - decrease stepsize and turn
				stepsize *= 0.6;
				direction *= -1;
			} else
				// too large and direction down - increase stepsize
				stepsize *= 1.1;
		} else {
			if(direction == -1) {
				// too small and direction down - decrease stepsize and turn
				stepsize *= 0.6;
				direction *= -1;
			} else
				// too small and direction up - increase stepsize
				stepsize *= 1.1;
		}
		source += direction * stepsize;
		
		// early stopping
		if( stepsize < error )
			break;
	}
/*	// note
	cout << "erfinv(" << target 
		<< ") = " << source 
		<< ", stepsize = " << stepsize 
		<< ", " << k << " steps, "
		<< " error = " << erf(source) - target << endl;
*/	
	return source;
}